

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerThread.cpp
# Opt level: O3

void __thiscall PathTracerThread::StopAndJoin(PathTracerThread *this)

{
  mutex *pmVar1;
  int iVar2;
  logger *plVar3;
  
  if ((this->m_viewer_thread)._M_id._M_thread == 0 &&
      (this->m_path_tracer_thread)._M_id._M_thread == 0) {
    return;
  }
  (this->m_pause)._M_base._M_i = false;
  (this->m_run)._M_base._M_i = false;
  plVar3 = spdlog::default_logger_raw();
  spdlog::logger::log(plVar3,0.0);
  pmVar1 = &(this->m_viewer_semaphore).m_mtx;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)pmVar1);
  if (iVar2 == 0) {
    if ((this->m_viewer_semaphore).m_state == false) {
      (this->m_viewer_semaphore).m_state = true;
      std::condition_variable::notify_one();
    }
    pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
    plVar3 = spdlog::default_logger_raw();
    spdlog::logger::log(plVar3,0.0);
    pmVar1 = &(this->m_pause_semaphore).m_mtx;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)pmVar1);
    if (iVar2 == 0) {
      if ((this->m_pause_semaphore).m_state == false) {
        (this->m_pause_semaphore).m_state = true;
        std::condition_variable::notify_one();
      }
      pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
      std::thread::join();
      std::thread::join();
      return;
    }
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void PathTracerThread::StopAndJoin() {
	if (!IsRunning())
		return;

	m_pause.store(false, std::memory_order_release);
	m_run.store(false, std::memory_order_release);

	spdlog::debug("m_viewer_semaphore signal");
	m_viewer_semaphore.signal();
	spdlog::debug("m_pause_semaphore signal");
	m_pause_semaphore.signal();

	m_path_tracer_thread.join();
	m_viewer_thread.join();
}